

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddLin.c
# Opt level: O0

int cuddZddLinearBackward(DdManager *table,int size,Move *moves)

{
  Move *pMVar1;
  int iVar2;
  Move *pMStack_30;
  int res;
  Move *move;
  Move *moves_local;
  int size_local;
  DdManager *table_local;
  
  moves_local._4_4_ = size;
  for (pMStack_30 = moves; pMVar1 = moves, pMStack_30 != (Move *)0x0; pMStack_30 = pMStack_30->next)
  {
    if (pMStack_30->size < moves_local._4_4_) {
      moves_local._4_4_ = pMStack_30->size;
    }
  }
  while( true ) {
    pMStack_30 = pMVar1;
    if (pMStack_30 == (Move *)0x0) {
      return 1;
    }
    if (pMStack_30->size == moves_local._4_4_) {
      return 1;
    }
    if ((pMStack_30->flags == 1) &&
       (iVar2 = cuddZddLinearInPlace(table,pMStack_30->x,pMStack_30->y), iVar2 == 0)) {
      return 0;
    }
    iVar2 = cuddZddSwapInPlace(table,pMStack_30->x,pMStack_30->y);
    if (iVar2 == 0) {
      return 0;
    }
    if ((pMStack_30->flags == 2) &&
       (iVar2 = cuddZddLinearInPlace(table,pMStack_30->x,pMStack_30->y), iVar2 == 0)) break;
    pMVar1 = pMStack_30->next;
  }
  return 0;
}

Assistant:

static int
cuddZddLinearBackward(
  DdManager * table,
  int  size,
  Move * moves)
{
    Move        *move;
    int         res;

    /* Find the minimum size among moves. */
    for (move = moves; move != NULL; move = move->next) {
        if (move->size < size) {
            size = move->size;
        }
    }

    for (move = moves; move != NULL; move = move->next) {
        if (move->size == size) return(1);
        if (move->flags == CUDD_LINEAR_TRANSFORM_MOVE) {
            res = cuddZddLinearInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
        }
        res = cuddZddSwapInPlace(table, move->x, move->y);
        if (!res)
            return(0);
        if (move->flags == CUDD_INVERSE_TRANSFORM_MOVE) {
            res = cuddZddLinearInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
        }
    }

    return(1);

}